

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O0

int match_ip(ip_rule_t *ipr,packet_t *pkt)

{
  uint16_t uVar1;
  int iVar2;
  bool local_21;
  packet_t *pkt_local;
  ip_rule_t *ipr_local;
  
  if (pkt->eth_type == 0x800) {
    if ((((pkt->ip->src & (ipr->smsk).s_addr) != (ipr->src).s_addr) == ((ipr->invert & 1) != 0)) &&
       (((pkt->ip->dst & (ipr->dmsk).s_addr) != (ipr->dst).s_addr) == ((ipr->invert & 2) != 0))) {
      iVar2 = match_iface(ipr->in,(pkt->iface).in);
      if ((iVar2 == 0) == ((ipr->invert & 4) != 0)) {
        iVar2 = match_iface(ipr->out,(pkt->iface).out);
        if ((iVar2 == 0) == ((ipr->invert & 8) != 0)) {
          if ((ipr->proto == '\0') || ((pkt->ip_proto != ipr->proto) == ((ipr->invert & 0x10) != 0))
             ) {
            uVar1 = ntohs(pkt->ip->frag);
            local_21 = false;
            if ((uVar1 & 0x1fff) == 0) {
              local_21 = ipr->frag != '\0';
            }
            if (local_21 == ((ipr->invert & 0x20) != 0)) {
              ipr_local._4_4_ = 1;
            }
            else {
              ipr_local._4_4_ = 0;
            }
          }
          else {
            ipr_local._4_4_ = 0;
          }
        }
        else {
          ipr_local._4_4_ = 0;
        }
      }
      else {
        ipr_local._4_4_ = 0;
      }
    }
    else {
      ipr_local._4_4_ = 0;
    }
  }
  else {
    ipr_local._4_4_ = 0;
  }
  return ipr_local._4_4_;
}

Assistant:

int match_ip(ip_rule_t *ipr, packet_t *pkt)
{
	if (pkt->eth_type != ETH_IP) {
		return 0;
	}

	if (INVF(ipr, INV_SRC, (pkt->ip->src & ipr->smsk.s_addr) != ipr->src.s_addr) ||
		INVF(ipr, INV_DST, (pkt->ip->dst & ipr->dmsk.s_addr) != ipr->dst.s_addr)) {
		return 0;
	}

	if (INVF(ipr, INV_IN, !match_iface(ipr->in, pkt->iface.in))) {
		return 0;
	}

	if (INVF(ipr, INV_OUT, !match_iface(ipr->out, pkt->iface.out))) {
		return 0;
	}

	if (ipr->proto && INVF(ipr, INV_PROTO, pkt->ip_proto != ipr->proto)) {
		return 0;
	}

	if (INVF(ipr, INV_FRAG, !IP_FRAGOFF(pkt->ip) && ipr->frag)) {
		return 0;
	}

	return 1;
}